

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

void inja::inja_throw(string *type,string *message)

{
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *message_local;
  string *type_local;
  
  local_18 = message;
  message_local = type;
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_78,"[inja.exception.",message_local);
  std::operator+(&local_58,&local_78,"] ");
  std::operator+(&local_38,&local_58,local_18);
  std::runtime_error::runtime_error(this,(string *)&local_38);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void inja_throw(const std::string& type, const std::string& message) {
  throw std::runtime_error("[inja.exception." + type + "] " + message);
}